

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDual.cpp
# Opt level: O0

bool __thiscall HEkkDual::acceptDualSteepestEdgeWeight(HEkkDual *this,double updated_edge_weight)

{
  double dVar1;
  long in_RDI;
  double in_XMM0_Qa;
  double unaff_retaddr;
  double in_stack_00000008;
  HEkk *in_stack_00000010;
  bool accept_weight;
  double in_stack_00000090;
  double in_stack_00000098;
  HighsSimplexAnalysis *in_stack_000000a0;
  
  dVar1 = *(double *)(in_RDI + 0x7f0);
  HEkk::assessDSEWeightError(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  HighsSimplexAnalysis::dualSteepestEdgeWeightError
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  return dVar1 * 0.25 <= in_XMM0_Qa;
}

Assistant:

bool HEkkDual::acceptDualSteepestEdgeWeight(const double updated_edge_weight) {
  // Accept the updated weight if it is at least a quarter of the
  // computed weight. Excessively large updated weights don't matter!
  const bool accept_weight =
      updated_edge_weight >= kAcceptDseWeightThreshold * computed_edge_weight;
  //  if (analysis->analyse_simplex_summary_data)
  ekk_instance_.assessDSEWeightError(computed_edge_weight, updated_edge_weight);
  analysis->dualSteepestEdgeWeightError(computed_edge_weight,
                                        updated_edge_weight);
  return accept_weight;
}